

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<double>::erase(RepeatedField<double> *this,const_iterator position)

{
  iterator pdVar1;
  const_iterator in_stack_00000018;
  RepeatedField<double> *in_stack_00000020;
  
  pdVar1 = erase(in_stack_00000020,in_stack_00000018,(const_iterator)this);
  return pdVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}